

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

interval_t duckdb::ToYearsOperator::Operation<long,duckdb::interval_t>(long input)

{
  interval_t iVar1;
  bool bVar2;
  int left;
  OutOfRangeException *this;
  allocator local_49;
  interval_t result;
  string local_38;
  
  left = Cast::Operation<long,int>(input);
  result.days = 0;
  result.micros = 0;
  bVar2 = TryMultiplyOperator::Operation<int,int,int>(left,0xc,&result.months);
  if (bVar2) {
    iVar1.days = result.days;
    iVar1.months = result.months;
    iVar1.micros = result.micros;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Interval value %d years out of range",&local_49);
  OutOfRangeException::OutOfRangeException<long>(this,&local_38,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_YEAR,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %d years out of range", input);
		}
		return result;
	}